

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O0

double __thiscall
soplex::SPxSolverBase<double>::coTest(SPxSolverBase<double> *this,int i,Status stat)

{
  double dVar1;
  double *pdVar2;
  undefined4 in_EDX;
  double x;
  undefined8 in_stack_ffffffffffffffa8;
  int n;
  SPxLPBase<double> *in_stack_ffffffffffffffb0;
  SPxLPBase<double> *this_00;
  double local_8;
  
  n = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  switch(in_EDX) {
  case 1:
  case 6:
    pdVar2 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_ffffffffffffffb0,n);
    dVar1 = *pdVar2;
    pdVar2 = SPxLPBase<double>::lower(in_stack_ffffffffffffffb0,n);
    if (dVar1 - *pdVar2 < 0.0) {
      return dVar1 - *pdVar2;
    }
  case 4:
    pdVar2 = SPxLPBase<double>::upper(in_stack_ffffffffffffffb0,n);
    local_8 = *pdVar2;
    pdVar2 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_ffffffffffffffb0,n);
    local_8 = local_8 - *pdVar2;
    break;
  case 2:
    pdVar2 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_ffffffffffffffb0,n);
    local_8 = *pdVar2;
    pdVar2 = SPxLPBase<double>::lower(in_stack_ffffffffffffffb0,n);
    local_8 = local_8 - *pdVar2;
    break;
  case 0xfffffffc:
    pdVar2 = SPxLPBase<double>::maxRowObj(in_stack_ffffffffffffffb0,n);
    local_8 = *pdVar2;
    pdVar2 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_ffffffffffffffb0,
                        (int)((ulong)local_8 >> 0x20));
    local_8 = local_8 - *pdVar2;
    break;
  default:
    local_8 = 0.0;
    break;
  case 0xfffffffe:
    pdVar2 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_ffffffffffffffb0,n);
    this_00 = (SPxLPBase<double> *)*pdVar2;
    pdVar2 = SPxLPBase<double>::maxRowObj(this_00,n);
    local_8 = (double)this_00 - *pdVar2;
  }
  return local_8;
}

Assistant:

R SPxSolverBase<R>::coTest(int i, typename SPxBasisBase<R>::Desc::Status stat) const
{
   assert(type() == ENTER);
   assert(!isBasic(stat));

   R x;

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::D_FREE:
   case SPxBasisBase<R>::Desc::D_ON_BOTH :
      assert(rep() == ROW);
      x = (*theCoPvec)[i] - SPxLPBase<R>::lower(i);

      if(x < 0)
         return x;

   // no break: next is else case
   //lint -fallthrough
   case SPxBasisBase<R>::Desc::D_ON_LOWER:
      assert(rep() == ROW);
      return SPxLPBase<R>::upper(i) - (*theCoPvec)[i];

   case SPxBasisBase<R>::Desc::D_ON_UPPER:
      assert(rep() == ROW);
      return (*theCoPvec)[i] - SPxLPBase<R>::lower(i);

   case SPxBasisBase<R>::Desc::P_ON_UPPER:
      assert(rep() == COLUMN);
      return (*theCoPvec)[i] - this->maxRowObj(i);             // slacks !

   case SPxBasisBase<R>::Desc::P_ON_LOWER:
      assert(rep() == COLUMN);
      return this->maxRowObj(i) - (*theCoPvec)[i];             // slacks !

   default:
      return 0;
   }
}